

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O2

node * init_node(void)

{
  node *in_RDI;
  
  in_RDI->parent = 0;
  in_RDI->min_count = 0;
  (in_RDI->preds)._begin = (node_pred *)0x0;
  (in_RDI->preds)._end = (node_pred *)0x0;
  (in_RDI->preds).end_array = (node_pred *)0x0;
  (in_RDI->preds).erase_count = 0;
  init_leaf(in_RDI);
  return in_RDI;
}

Assistant:

inline node init_node()
{
  node node;

  node.parent = 0;
  node.min_count = 0;
  node.preds = v_init<node_pred>();
  init_leaf(node);

  return node;
}